

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O1

MRIStepCoupling MRIStepCoupling_Copy(MRIStepCoupling MRIC)

{
  uint nmat;
  uint stages;
  realtype ***ppprVar1;
  realtype *prVar2;
  realtype *prVar3;
  realtype **pprVar4;
  realtype **pprVar5;
  int iVar6;
  MRIStepCoupling pMVar7;
  MRISTEP_METHOD_TYPE type;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (MRIC == (MRIStepCoupling)0x0) {
    return (MRIStepCoupling)0x0;
  }
  ppprVar1 = MRIC->W;
  if (ppprVar1 != (realtype ***)0x0) {
    type = MRISTEP_IMEX;
    if (MRIC->G != (realtype ***)0x0) goto LAB_0050b331;
    if (ppprVar1 != (realtype ***)0x0) {
      if (MRIC->G == (realtype ***)0x0) {
        type = MRISTEP_EXPLICIT;
        goto LAB_0050b331;
      }
      if (ppprVar1 != (realtype ***)0x0) {
        return (MRIStepCoupling)0x0;
      }
    }
  }
  type = MRISTEP_IMPLICIT;
  if (MRIC->G == (realtype ***)0x0) {
    return (MRIStepCoupling)0x0;
  }
LAB_0050b331:
  if (MRIC->c != (realtype *)0x0) {
    nmat = MRIC->nmat;
    stages = MRIC->stages;
    uVar11 = (ulong)stages;
    pMVar7 = MRIStepCoupling_Alloc(nmat,stages,type);
    if (pMVar7 != (MRIStepCoupling)0x0) {
      iVar6 = MRIC->p;
      pMVar7->q = MRIC->q;
      pMVar7->p = iVar6;
      if (0 < (int)stages) {
        prVar2 = MRIC->c;
        prVar3 = pMVar7->c;
        uVar8 = 0;
        do {
          prVar3[uVar8] = prVar2[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar11 != uVar8);
      }
      ppprVar1 = MRIC->W;
      if (0 < (int)nmat && ppprVar1 != (realtype ***)0x0) {
        uVar8 = 0;
        do {
          if (0 < (int)stages) {
            pprVar4 = ppprVar1[uVar8];
            pprVar5 = pMVar7->W[uVar8];
            uVar9 = 0;
            do {
              prVar2 = pprVar4[uVar9];
              prVar3 = pprVar5[uVar9];
              uVar10 = 0;
              do {
                prVar3[uVar10] = prVar2[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar11);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != nmat);
      }
      ppprVar1 = MRIC->G;
      if (0 < (int)nmat && ppprVar1 != (realtype ***)0x0) {
        uVar8 = 0;
        do {
          if (0 < (int)stages) {
            pprVar4 = ppprVar1[uVar8];
            pprVar5 = pMVar7->G[uVar8];
            uVar9 = 0;
            do {
              prVar2 = pprVar4[uVar9];
              prVar3 = pprVar5[uVar9];
              uVar10 = 0;
              do {
                prVar3[uVar10] = prVar2[uVar10];
                uVar10 = uVar10 + 1;
              } while (uVar11 != uVar10);
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar11);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != nmat);
        return pMVar7;
      }
      return pMVar7;
    }
  }
  return (MRIStepCoupling)0x0;
}

Assistant:

MRIStepCoupling MRIStepCoupling_Copy(MRIStepCoupling MRIC)
{
  int i, j, k, nmat, stages;
  MRISTEP_METHOD_TYPE type;
  MRIStepCoupling MRICcopy;

  /* Check for legal input */
  if (!MRIC) return(NULL);

  /* Check for method coefficients and set method type */
  if (MRIC->W && MRIC->G)
    type = MRISTEP_IMEX;
  else if (MRIC->W && !(MRIC->G))
    type = MRISTEP_EXPLICIT;
  else if (!(MRIC->W) && MRIC->G)
    type = MRISTEP_IMPLICIT;
  else
    return(NULL);

  /* Check for stage times */
  if (!(MRIC->c)) return(NULL);

  /* Get the number of coupling matrices and stages */
  nmat   = MRIC->nmat;
  stages = MRIC->stages;

  /* Allocate coupling structure */
  MRICcopy = MRIStepCoupling_Alloc(nmat, stages, type);
  if (!MRICcopy) return(NULL);

  /* Copy method and embedding orders */
  MRICcopy->q = MRIC->q;
  MRICcopy->p = MRIC->p;

  /* Copy abscissae */
  for (i=0; i<stages; i++)
    MRICcopy->c[i] = MRIC->c[i];

  /* Copy explicit coupling matrices W */
  if (MRIC->W)
    for (k = 0; k < nmat; k++)
      for (i = 0; i < stages; i++)
        for (j = 0; j < stages; j++)
          MRICcopy->W[k][i][j] = MRIC->W[k][i][j];

  /* Copy implicit coupling matrices G */
  if (MRIC->G)
    for (k = 0; k < nmat; k++)
      for (i = 0; i < stages; i++)
        for (j = 0; j < stages; j++)
          MRICcopy->G[k][i][j] = MRIC->G[k][i][j];

  return(MRICcopy);
}